

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_candidate_index_impl.h
# Opt level: O1

void __thiscall
histo_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *label_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *degree_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *leaf_distance_histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  iterator iVar4;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *pvVar5;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *pvVar6;
  mapped_type *pmVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  pair<int,_int> *il_entry;
  pointer __args;
  int *piVar12;
  int iVar13;
  pointer ppVar14;
  _Hash_node_base *p_Var15;
  iterator __end2;
  __node_base *p_Var16;
  int pre_cand_id;
  int current_tree_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  int local_b8;
  int local_b4;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_b0;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  double local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_70;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_68;
  pointer local_60;
  CandidateIndex *local_58;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  
  local_b0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates;
  local_90 = distance_threshold;
  local_70 = degree_histogram_collection;
  local_68 = leaf_distance_histogram_collection;
  local_58 = this;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_48,(long)(il_size + 1),(allocator_type *)&local_88);
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a8);
  ppVar14 = (label_histogram_collection->
            super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (label_histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = label_histogram_collection;
  if (ppVar14 != local_60) {
    do {
      local_a8 = (int *)0x0;
      iStack_a0._M_current = (int *)0x0;
      local_98 = (int *)0x0;
      if (((double)ppVar14->first <= local_90) && (local_b8 = 0, 0 < local_b4)) {
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_b8);
          }
          else {
            *iStack_a0._M_current = local_b8;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_b8] =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_b8] + 1;
          local_b8 = local_b8 + 1;
        } while (local_b8 < local_b4);
      }
      p_Var16 = &(ppVar14->second)._M_h._M_before_begin;
      while (iVar4._M_current = iStack_a0._M_current, p_Var16 = p_Var16->_M_nxt,
            p_Var16 != (__node_base *)0x0) {
        ppVar1 = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var16 + 1)].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (__args = local_48.
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var16 + 1)].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; __args != ppVar1;
            __args = __args + 1) {
          iVar13 = *(int *)((long)(p_Var16 + 1) + 4);
          if (__args->second < *(int *)((long)(p_Var16 + 1) + 4)) {
            iVar13 = __args->second;
          }
          if ((local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[__args->first] == 0) && (iVar13 != 0)) {
            if (iStack_a0._M_current == local_98) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&__args->first);
            }
            else {
              *iStack_a0._M_current = __args->first;
              iStack_a0._M_current = iStack_a0._M_current + 1;
            }
          }
          iVar9 = iVar13 + local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[__args->first];
          if (ppVar14->first <
              iVar13 + local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[__args->first]) {
            iVar9 = ppVar14->first;
          }
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[__args->first] = iVar9;
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   (local_48.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)*(size_type *)(p_Var16 + 1)),
                   &local_b4,(int *)((long)(p_Var16 + 1) + 4));
      }
      local_58->pre_candidates_ =
           local_58->pre_candidates_ + ((long)iStack_a0._M_current - (long)local_a8 >> 2);
      for (piVar12 = local_a8; iVar4._M_current != piVar12; piVar12 = piVar12 + 1) {
        local_b8 = *piVar12;
        ppVar2 = (local_50->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((double)((ppVar2[local_b8].first + ppVar2[local_b4].first +
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_b8] * -2) / 2) <= local_90) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(local_b0,&local_b4,&local_b8);
        }
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_b8] = 0;
      }
      local_b4 = local_b4 + 1;
      if (local_a8 != (int *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != local_60);
  }
  pvVar6 = local_68;
  pvVar5 = local_70;
  piVar12 = *(int **)local_b0;
  do {
    if (piVar12 == *(int **)(local_b0 + 8)) break;
    p_Var15 = (pvVar5->
              super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[*piVar12].second._M_h._M_before_begin.
              _M_nxt;
    iVar13 = 0;
    if (p_Var15 != (_Hash_node_base *)0x0) {
      do {
        pmVar7 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(pvVar5->
                                  super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[piVar12[1]].second,
                              (key_type *)(p_Var15 + 1));
        iVar9 = *(int *)((long)&p_Var15[1]._M_nxt + 4);
        if (*pmVar7 < iVar9) {
          iVar9 = *pmVar7;
        }
        iVar13 = iVar13 + iVar9;
        p_Var15 = p_Var15->_M_nxt;
      } while (p_Var15 != (_Hash_node_base *)0x0);
      iVar13 = iVar13 * 2;
    }
    ppVar14 = (pvVar5->
              super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((double)(((ppVar14[*piVar12].first - iVar13) + ppVar14[piVar12[1]].first) / 5) <= local_90)
    {
      p_Var15 = (pvVar6->
                super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[*piVar12].second._M_h._M_before_begin.
                _M_nxt;
      iVar13 = 0;
      if (p_Var15 != (_Hash_node_base *)0x0) {
        do {
          pmVar7 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&(pvVar6->
                                    super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[piVar12[1]].second,
                                (key_type *)(p_Var15 + 1));
          iVar9 = *(int *)((long)&p_Var15[1]._M_nxt + 4);
          if (*pmVar7 < iVar9) {
            iVar9 = *pmVar7;
          }
          iVar13 = iVar13 + iVar9;
          p_Var15 = p_Var15->_M_nxt;
        } while (p_Var15 != (_Hash_node_base *)0x0);
        iVar13 = iVar13 * 2;
      }
      ppVar14 = (pvVar5->
                super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (local_90 < (double)((ppVar14[*piVar12].first - iVar13) + ppVar14[piVar12[1]].first)) {
        piVar8 = *(int **)(local_b0 + 8);
        if ((piVar12 + 2 != piVar8) &&
           (lVar10 = (long)piVar8 - (long)(piVar12 + 2) >> 3, 0 < lVar10)) {
          lVar10 = lVar10 + 1;
          piVar11 = piVar12 + 3;
          do {
            *(undefined8 *)(piVar11 + -3) = *(undefined8 *)(piVar11 + -1);
            lVar10 = lVar10 + -1;
            piVar11 = piVar11 + 2;
          } while (1 < lVar10);
        }
        goto LAB_001064c1;
      }
      piVar12 = piVar12 + 2;
      bVar3 = true;
    }
    else {
      piVar8 = *(int **)(local_b0 + 8);
      if ((piVar12 + 2 != piVar8) && (lVar10 = (long)piVar8 - (long)(piVar12 + 2) >> 3, 0 < lVar10))
      {
        lVar10 = lVar10 + 1;
        piVar11 = piVar12 + 3;
        do {
          *(undefined8 *)(piVar11 + -3) = *(undefined8 *)(piVar11 + -1);
          lVar10 = lVar10 + -1;
          piVar11 = piVar11 + 2;
        } while (1 < lVar10);
      }
LAB_001064c1:
      *(int **)(local_b0 + 8) = piVar8 + -2;
      bVar3 = false;
    }
  } while (bVar3);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& label_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& degree_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& leaf_distance_histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(label_histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: label_histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    // get precandidates from the inverted list by looking up all elements
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((label_histogram_collection[current_tree_id].first + label_histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }

  // apply degree and leaf distance lower bound for all candidates
  auto cand = std::begin(join_candidates);
  while(cand != std::end(join_candidates)) {
    // count degree intersection
    int intersection = 0;
    for(auto& element: degree_histogram_collection[cand->first].second)
      intersection += std::min(element.second, degree_histogram_collection[cand->second].second[element.first]);
    // remove pair if degree lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) / 5 > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    // count leaf distance intersection
    intersection = 0;
    for(auto& element: leaf_distance_histogram_collection[cand->first].second)
      intersection += std::min(element.second, leaf_distance_histogram_collection[cand->second].second[element.first]);
    // remove pair if leaf distance lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    cand++;
  }
}